

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_iterator.hpp
# Opt level: O3

void __thiscall
burst::detail::
join_iterator_impl<burst::owning_iterator<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>_>_>,_boost::iterators::random_access_traversal_tag>
::maintain_invariant
          (join_iterator_impl<burst::owning_iterator<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>_>_>,_boost::iterators::random_access_traversal_tag>
           *this)

{
  iterator_range<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>
  *piVar1;
  element_type *peVar2;
  element_type *peVar3;
  iterator_range<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>
  *piVar4;
  char *pcVar5;
  iterator_range<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>
  *piVar6;
  iterator_range<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>
  *piVar7;
  
  piVar1 = (this->m_outer).m_iterator._M_current;
  if ((this->m_inner)._M_current ==
      (piVar1->
      super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
      ).
      super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
      .
      super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
      .m_End._M_current) {
    peVar2 = (this->m_outer).m_container.
             super___shared_ptr<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    peVar3 = (this->m_end).m_container.
             super___shared_ptr<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    piVar4 = (this->m_end).m_iterator._M_current;
    do {
      piVar7 = piVar1 + 1;
      (this->m_outer).m_iterator._M_current = piVar7;
      if (peVar2 != peVar3) {
        __assert_fail("this->m_container == that.m_container",
                      "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/owning_iterator.hpp"
                      ,0x55,
                      "bool burst::owning_iterator<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<const char *, std::vector<char>>>>>::equal(const owning_iterator<Container> &) const [Container = std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<const char *, std::vector<char>>>>]"
                     );
      }
    } while ((piVar7 != piVar4) &&
            (pcVar5 = (piVar7->
                      super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
                      ).
                      super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
                      .
                      super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
                      .m_Begin._M_current, (this->m_inner)._M_current = pcVar5, piVar6 = piVar1 + 1,
            piVar1 = piVar7,
            pcVar5 == (piVar6->
                      super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
                      ).
                      super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
                      .
                      super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
                      .m_End._M_current));
  }
  return;
}

Assistant:

void maintain_invariant ()
            {
                while (m_inner == m_outer->end() &&
                    ++m_outer != m_end)
                {
                    m_inner = m_outer->begin();
                }
            }